

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-wast-parser.cc
# Opt level: O0

Errors * anon_unknown.dwarf_90392::ParseInvalidModule(Errors *__return_storage_ptr__,string *text)

{
  bool bVar1;
  size_t size;
  pointer lexer_00;
  char *message;
  string_view filename;
  AssertHelper local_88;
  Message local_80;
  Enum local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  Result result;
  WastParseOptions options;
  Features features;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  string_view local_30;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> local_20;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  string *text_local;
  Errors *errors;
  
  lexer._M_t.super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
  super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)
       (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)text;
  wabt::string_view::string_view(&local_30,"test");
  size = std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  filename.size_ = (size_type)local_30.data_;
  filename.data_ = (char *)&local_20;
  wabt::WastLexer::CreateBufferLexer(filename,(void *)local_30.size_,size);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector(__return_storage_ptr__);
  std::unique_ptr<wabt::Module,std::default_delete<wabt::Module>>::
  unique_ptr<std::default_delete<wabt::Module>,void>
            ((unique_ptr<wabt::Module,std::default_delete<wabt::Module>> *)&features.simd_enabled_);
  wabt::Features::Features((Features *)&options.features.threads_enabled_);
  wabt::WastParseOptions::WastParseOptions
            ((WastParseOptions *)((long)&gtest_ar.message_.ptr_ + 7),
             (Features *)&options.features.threads_enabled_);
  lexer_00 = std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::get(&local_20)
  ;
  gtest_ar.message_.ptr_._0_4_ =
       wabt::ParseWatModule
                 (lexer_00,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                           &features.simd_enabled_,__return_storage_ptr__,
                  (WastParseOptions *)((long)&gtest_ar.message_.ptr_ + 7));
  local_74 = Error;
  testing::internal::EqHelper<false>::Compare<wabt::Result::Enum,wabt::Result>
            ((EqHelper<false> *)local_70,"Result::Error","result",&local_74,
             (Result *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-wast-parser.cc"
               ,0x2b,message);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
            ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)&features.simd_enabled_
            );
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&local_20);
  return __return_storage_ptr__;
}

Assistant:

Errors ParseInvalidModule(std::string text) {
  auto lexer = WastLexer::CreateBufferLexer("test", text.c_str(), text.size());
  Errors errors;
  std::unique_ptr<Module> module;
  Features features;
  WastParseOptions options(features);
  Result result = ParseWatModule(lexer.get(), &module, &errors, &options);
  EXPECT_EQ(Result::Error, result);

  return errors;
}